

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocateAndGrow
          (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *old)

{
  long lVar1;
  bool bVar2;
  NamespaceDeclaration *pNVar3;
  QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  NamespaceDeclaration *in_stack_ffffffffffffff70;
  NamespaceDeclaration *in_stack_ffffffffffffff78;
  QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                           in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                 &DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pNVar3 = data((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                      &stack0xffffffffffffffe0), pNVar3 == (NamespaceDeclaration *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_006675a2;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                          in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                  operator->((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x6674a7);
        begin((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x6674b6);
        QtPrivate::QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (NamespaceDeclaration *)
             operator->((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                        &stack0xffffffffffffffe0);
        pNVar3 = begin((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                       0x6674f5);
        begin((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x667504);
        QtPrivate::QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::moveAppend
                  (in_stack_ffffffffffffff80,pNVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
         in_stack_ffffffffffffff70,
         (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
           in_stack_ffffffffffffff70,
           (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                       in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
               in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                   in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocate
              ((QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
               in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_006675a2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }